

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O0

void __thiscall slang::ast::NetSymbol::serializeTo(NetSymbol *this,ASTSerializer *serializer)

{
  bool bVar1;
  TimingControl *__n;
  NetSymbol *in_RSI;
  long in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string_view sVar3;
  type *ds1;
  type *ds0;
  optional<slang::ast::ChargeStrength> chargeStrength;
  TimingControl *delayCtrl;
  size_t in_stack_fffffffffffffe98;
  NetSymbol *in_stack_fffffffffffffea0;
  NetSymbol *in_stack_fffffffffffffea8;
  NetSymbol *in_stack_fffffffffffffeb0;
  undefined8 local_110;
  undefined4 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined4 local_e0;
  undefined8 local_d8;
  undefined8 local_b0;
  undefined4 local_a0;
  NetSymbol *in_stack_ffffffffffffff68;
  undefined4 local_88;
  undefined8 local_80;
  undefined8 local_70;
  undefined4 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined4 local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined8 local_18;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb0,
             (char *)in_stack_fffffffffffffea8);
  ASTSerializer::write((ASTSerializer *)in_RSI,local_20,local_18,*(size_t *)(in_RDI + 0x150));
  if ((*(byte *)(in_RDI + 0x15c) & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb0,
               (char *)in_stack_fffffffffffffea8);
    ASTSerializer::write
              ((ASTSerializer *)in_RSI,local_30,local_28,(ulong)(*(byte *)(in_RDI + 0x15c) & 1));
  }
  if (*(int *)(in_RDI + 0x158) == 1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb0,
               (char *)in_stack_fffffffffffffea8);
    bVar2 = sv((char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    local_50 = bVar2._M_len;
    ASTSerializer::write((ASTSerializer *)in_RSI,local_40,local_38,local_50);
  }
  else if (*(int *)(in_RDI + 0x158) == 2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb0,
               (char *)in_stack_fffffffffffffea8);
    bVar2 = sv((char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    local_70 = bVar2._M_len;
    ASTSerializer::write((ASTSerializer *)in_RSI,local_60,local_58,local_70);
  }
  __n = getDelay(in_stack_ffffffffffffff68);
  if (__n != (TimingControl *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb0,
               (char *)in_stack_fffffffffffffea8);
    ASTSerializer::write((ASTSerializer *)in_RSI,local_88,local_80,(size_t)__n);
  }
  getChargeStrength(in_stack_fffffffffffffea8);
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::ast::ChargeStrength> *)0x537fa5);
  if (bVar1) {
    in_stack_fffffffffffffeb0 = in_RSI;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
               (char *)in_stack_fffffffffffffea8);
    std::optional<slang::ast::ChargeStrength>::operator*
              ((optional<slang::ast::ChargeStrength> *)0x537fd9);
    sVar3 = ast::toString(Small);
    local_b0 = sVar3._M_len;
    ASTSerializer::write
              ((ASTSerializer *)in_stack_fffffffffffffeb0,local_a0,in_stack_ffffffffffffff68,
               local_b0);
  }
  getDriveStrength(in_stack_fffffffffffffea0);
  std::get<0ul,std::optional<slang::ast::DriveStrength>,std::optional<slang::ast::DriveStrength>>
            ((pair<std::optional<slang::ast::DriveStrength>,_std::optional<slang::ast::DriveStrength>_>
              *)0x538041);
  std::get<1ul,std::optional<slang::ast::DriveStrength>,std::optional<slang::ast::DriveStrength>>
            ((pair<std::optional<slang::ast::DriveStrength>,_std::optional<slang::ast::DriveStrength>_>
              *)0x538056);
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::ast::DriveStrength> *)0x53806b);
  if (bVar1) {
    in_stack_fffffffffffffea8 = in_RSI;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb0,
               (char *)in_RSI);
    std::optional<slang::ast::DriveStrength>::operator*
              ((optional<slang::ast::DriveStrength> *)0x53809f);
    sVar3 = ast::toString(Supply);
    local_f0 = sVar3._M_len;
    ASTSerializer::write((ASTSerializer *)in_stack_fffffffffffffea8,local_e0,local_d8,local_f0);
  }
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::ast::DriveStrength> *)0x5380e7);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb0,
               (char *)in_stack_fffffffffffffea8);
    std::optional<slang::ast::DriveStrength>::operator*
              ((optional<slang::ast::DriveStrength> *)0x538118);
    sVar3 = ast::toString(Supply);
    local_110 = sVar3._M_len;
    ASTSerializer::write((ASTSerializer *)in_RSI,local_100,local_f8,local_110);
  }
  return;
}

Assistant:

void NetSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("netType", netType);

    if (isImplicit)
        serializer.write("isImplicit", isImplicit);

    switch (expansionHint) {
        case Vectored:
            serializer.write("expansionHint", "vectored"sv);
            break;
        case Scalared:
            serializer.write("expansionHint", "scalared"sv);
            break;
        default:
            break;
    }

    if (auto delayCtrl = getDelay())
        serializer.write("delay", *delayCtrl);

    if (auto chargeStrength = getChargeStrength())
        serializer.write("chargeStrength", toString(*chargeStrength));

    auto [ds0, ds1] = getDriveStrength();
    if (ds0)
        serializer.write("driveStrength0", toString(*ds0));
    if (ds1)
        serializer.write("driveStrength1", toString(*ds1));
}